

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_to_core.cpp
# Opt level: O2

Literal * skiwi::anon_unknown_26::_make_false(void)

{
  variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  *in_RDI;
  undefined1 local_58 [32];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  std::__detail::__variant::
  _Variant_storage<false,skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  ::_Variant_storage<0ul>();
  local_58[8] = false;
  local_38._M_p = (pointer)&local_28;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_58._0_4_ = -1;
  local_58._4_4_ = -1;
  std::
  variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  ::operator=(in_RDI,(False *)local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (Literal *)in_RDI;
}

Assistant:

Literal _make_false()
    {
    Literal lit;
    False fa;
    fa.line_nr = -1;
    fa.column_nr = -1;
    lit = fa;
    return lit;
    }